

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.cpp
# Opt level: O1

string * hmac::get_hmac(string *__return_storage_ptr__,string *key_input,string *msg,TypeHash type,
                       bool is_hex,bool is_upper)

{
  ulong uVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  size_type *psVar6;
  size_t i;
  ulong uVar7;
  string ikeypad;
  string key;
  string okeypad;
  string local_110;
  string local_f0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (type < (SHA512|SHA256)) {
    uVar1 = *(ulong *)(&DAT_00108878 + (ulong)type * 8);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar2 = (key_input->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + key_input->_M_string_length);
    if (uVar1 < local_f0._M_string_length) {
      get_hash(&local_110,&local_f0,type);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
    }
    if (local_f0._M_string_length < uVar1) {
      std::__cxx11::string::resize((ulong)&local_f0,(char)uVar1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_d0 = local_c0;
    local_c8 = 0;
    local_c0[0] = 0;
    std::__cxx11::string::reserve((ulong)&local_110);
    std::__cxx11::string::reserve((ulong)&local_d0);
    uVar7 = 0;
    do {
      std::__cxx11::string::push_back((char)&local_110);
      std::__cxx11::string::push_back((char)&local_d0);
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    if (is_hex) {
      std::operator+(&local_50,&local_110,msg);
      get_hash(&local_70,&local_50,type);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_d0)
      ;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      get_hash(&local_90,&local_b0,type);
      to_hex(__return_storage_ptr__,&local_90,is_upper);
    }
    else {
      std::operator+(&local_70,&local_110,msg);
      get_hash(&local_b0,&local_70,type);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0)
      ;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_90.field_2._M_allocated_capacity = *psVar6;
        local_90.field_2._8_8_ = plVar5[3];
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar6;
        local_90._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_90._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      get_hash(__return_storage_ptr__,&local_90,type);
    }
    if (is_hex) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pbVar4 = &local_50;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      pbVar4 = &local_70;
    }
    puVar3 = *(undefined1 **)((pbVar4->field_2)._M_local_buf + -0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &pbVar4->field_2) {
      operator_delete(puVar3);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_hmac(const std::string& key_input, const std::string &msg, TypeHash type, bool is_hex, bool is_upper) {
        size_t block_size = 0;
        switch(type) {
        case TypeHash::SHA1:
            block_size = hmac_hash::SHA1::BLOCK_SIZE;
            break;
        case TypeHash::SHA256:
            block_size = hmac_hash::SHA256::SHA224_256_BLOCK_SIZE;
            break;
        case TypeHash::SHA512:
            block_size = hmac_hash::SHA512::SHA384_512_BLOCK_SIZE;
            break;
        default:
            return std::string();
        };

        std::string key = key_input;
        
        if(key.size() > block_size) {
            /* If key length > block size, hash it and pad with zeros to block size */
            key = get_hash(key, type);
        }
        if(key.size() < block_size) {
            /* Pad key with zeros if it's shorter than block size */
            key.resize(block_size, '\0');
        }
        
        /* If key length == block size, use it as is */
        std::string ikeypad;
        std::string okeypad;
        
        ikeypad.reserve(block_size);
        okeypad.reserve(block_size);
        
        for(size_t i = 0; i < block_size; ++i) {
            ikeypad.push_back(0x36 ^ key[i]);
            okeypad.push_back(0x5c ^ key[i]);
        }

        return is_hex 
            ? to_hex(get_hash(okeypad + get_hash(ikeypad + msg, type), type), is_upper) 
            : get_hash(okeypad + get_hash(ikeypad + msg, type), type);
    }